

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  pointer pcVar1;
  
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__StyledWriter_001f3aa8;
  pcVar1 = (this->indentString_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->indentString_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->document_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->document_).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->childValues_);
  return;
}

Assistant:

~StyledWriter() JSONCPP_OVERRIDE {}